

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task20.cpp
# Opt level: O2

int main(void)

{
  ulong in_RAX;
  int *arr;
  ostream *poVar1;
  ulong uVar2;
  int i_1;
  int *piVar3;
  int i;
  long lVar4;
  ulong uVar5;
  ulong uStack_38;
  int n;
  
  uStack_38 = in_RAX;
  std::istream::operator>>((istream *)&std::cin,&n);
  uVar5 = (ulong)n;
  uVar2 = 0xffffffffffffffff;
  if (-1 < (long)uVar5) {
    uVar2 = uVar5 * 4;
  }
  arr = (int *)operator_new__(uVar2);
  piVar3 = arr;
  for (lVar4 = 0; lVar4 < (int)uVar5; lVar4 = lVar4 + 1) {
    std::istream::operator>>((istream *)&std::cin,piVar3);
    uVar5 = uStack_38 >> 0x20;
    piVar3 = piVar3 + 1;
  }
  bubble_sort(arr,(int)uVar5);
  for (lVar4 = 0; lVar4 < (int)uVar5; lVar4 = lVar4 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,arr[lVar4]);
    std::operator<<(poVar1,' ');
    uVar5 = uStack_38 >> 0x20;
  }
  operator_delete__(arr);
  return 0;
}

Assistant:

int main(){
    int n;
    cin >> n;
    int* arr = new int [n];
    for (int i = 0; i < n; i++) cin >> arr[i];
    bubble_sort(arr, n);
    for (int i = 0; i < n; i++) cout << arr[i] << ' ';
    delete[] arr;
    return 0;
}